

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcv.c
# Opt level: O0

int tcv_get_vendor_date_code(tcv_t *tcv,tcv_date_code_t *date_code)

{
  _Bool _Var1;
  int local_24;
  int ret;
  tcv_date_code_t *date_code_local;
  tcv_t *tcv_local;
  
  local_24 = -0xd;
  _Var1 = tcv_check_and_lock_ok(tcv);
  if ((_Var1) && (date_code != (tcv_date_code_t *)0x0)) {
    _Var1 = tcv_is_initialized(tcv);
    if (_Var1) {
      local_24 = (*tcv->fun->get_vendor_date_code)(tcv,date_code);
    }
    tcv_unlock(tcv);
    tcv_local._4_4_ = local_24;
  }
  else {
    tcv_local._4_4_ = -4;
  }
  return tcv_local._4_4_;
}

Assistant:

int tcv_get_vendor_date_code(tcv_t *tcv, tcv_date_code_t *date_code)
{
	int ret = TCV_ERR_NOT_INITIALIZED;

	if (!tcv_check_and_lock_ok(tcv) || !date_code)
		return TCV_ERR_INVALID_ARG;

	if (tcv_is_initialized(tcv)) {
		ret = tcv->fun->get_vendor_date_code(tcv, date_code);
	}
	tcv_unlock(tcv);
	return ret;
}